

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall
Fad<long_double>::Fad<FadBinaryAdd<Fad<long_double>,Fad<long_double>>>
          (Fad<long_double> *this,
          FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_> *fadexpr)

{
  int iVar1;
  longdouble *plVar2;
  FadSuper *in_RDI;
  unkbyte10 in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar3;
  longdouble in_ST7;
  int i;
  int sz;
  int in_stack_ffffffffffffff9c;
  longdouble in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffdc;
  int i_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  FadSuper::FadSuper(in_RDI);
  FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_>::val
            ((FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_> *)0x133f18f);
  *(unkbyte10 *)in_RDI = in_ST0;
  FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_>::size
            ((FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_> *)0x133f1b8);
  Vector<long_double>::Vector
            ((Vector<long_double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  *(longdouble *)(in_RDI + 0x20) = (longdouble)0;
  lVar3 = in_ST7;
  iVar1 = FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_>::size
                    ((FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_> *)0x133f1e2);
  if (iVar1 != 0) {
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_>::dx
                (SUB108(in_stack_ffffffffffffffa0,0),in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffa0 = in_ST1;
      plVar2 = Vector<long_double>::operator[]((Vector<long_double> *)(in_RDI + 0x10),i_00);
      *plVar2 = in_stack_ffffffffffffffa0;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = lVar3;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }